

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.h
# Opt level: O2

TProb<double> * __thiscall libDAI::TProb<double>::divide(TProb<double> *this,TProb<double> *q)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  ulong uVar4;
  
  pdVar1 = (this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar3 = (q->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar4 = 0; uVar4 < (ulong)((long)pdVar2 - (long)pdVar1 >> 3); uVar4 = uVar4 + 1) {
    pdVar1[uVar4] = pdVar1[uVar4] / pdVar3[uVar4];
  }
  return this;
}

Assistant:

TProb<T>& divide (const TProb<T> & q) {
#ifdef DEBUG
                assert( size() == q.size() );
#endif
                for( size_t i = 0; i < size(); i++ )
                    _p[i] /= q[i];
                return *this;
            }